

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SeedTest<unsigned_int>(pfHash hash,int keycount,bool drawDiagram)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  printf("Keyset \'Seed\' - %d keys\n");
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,(long)keycount);
  if (0 < keycount) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      (*hash)("The quick brown fox jumps over the lazy dog",0x2b,uVar2,
              (void *)((long)local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar3));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)keycount << 2 != lVar3);
  }
  bVar1 = TestHashList<unsigned_int>(&local_48,drawDiagram,true,true,true,true);
  putchar(10);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SeedTest ( pfHash hash, int keycount, bool drawDiagram )
{
  printf("Keyset 'Seed' - %d keys\n",keycount);

  const char * text = "The quick brown fox jumps over the lazy dog";
  const int len = (int)strlen(text);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(text,len,i,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  return result;
}